

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O2

SpatialForceVector * __thiscall
iDynTree::SpatialMotionVector::cross
          (SpatialForceVector *__return_storage_ptr__,SpatialMotionVector *this,
          SpatialForceVector *other)

{
  AngularVector3T *this_00;
  GeomVector3 local_70;
  GeomVector3 local_58;
  GeomVector3 local_40;
  
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_00237ca8
  ;
  this_00 = &(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  GeomVector3::cross(&local_70,this_00,
                     &(other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = local_70.super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = local_70.super_Vector3.m_data[0];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = local_70.super_Vector3.m_data[1];
  GeomVector3::cross(&local_40,(GeomVector3 *)this,
                     &(other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3);
  GeomVector3::cross(&local_58,this_00,
                     &(other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3);
  GeomVector3::operator+(&local_70,&local_40,&local_58);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = local_70.super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = local_70.super_Vector3.m_data[0];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = local_70.super_Vector3.m_data[1];
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector SpatialMotionVector::cross(const SpatialForceVector& other) const
{
    SpatialForceVector res;

    res.getLinearVec3()  = this->angularVec3.cross(other.getLinearVec3());
    res.getAngularVec3() = this->linearVec3.cross(other.getLinearVec3()) + this->angularVec3.cross(other.getAngularVec3());

    return res;
}